

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O3

string * __thiscall
CLI::Option::help_positional_abi_cxx11_(string *__return_storage_ptr__,Option *this)

{
  size_type *psVar1;
  bool bVar2;
  uint uVar3;
  pointer pcVar4;
  uint __val;
  uint uVar5;
  undefined8 *puVar6;
  long *plVar7;
  uint uVar8;
  ulong uVar9;
  ulong *puVar10;
  uint __len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ulong *local_b0;
  long local_a8;
  ulong local_a0;
  long lStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar4 = (this->pname_)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar4,pcVar4 + (this->pname_)._M_string_length);
  if (this->expected_ < 2) {
    if (this->expected_ != -1) goto LAB_00113fc5;
    pcVar4 = (__return_storage_ptr__->_M_dataplus)._M_p;
    local_b0 = &local_a0;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar4,pcVar4 + __return_storage_ptr__->_M_string_length);
    ::std::__cxx11::string::append((char *)&local_b0);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b0);
    puVar10 = local_b0;
    if (local_b0 == &local_a0) goto LAB_00113fc5;
  }
  else {
    local_70 = local_60;
    pcVar4 = (__return_storage_ptr__->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar4,pcVar4 + __return_storage_ptr__->_M_string_length);
    ::std::__cxx11::string::append((char *)&local_70);
    uVar3 = this->expected_;
    __val = -uVar3;
    if (0 < (int)uVar3) {
      __val = uVar3;
    }
    __len = 1;
    if (9 < __val) {
      uVar9 = (ulong)__val;
      uVar5 = 4;
      do {
        __len = uVar5;
        uVar8 = (uint)uVar9;
        if (uVar8 < 100) {
          __len = __len - 2;
          goto LAB_00113e43;
        }
        if (uVar8 < 1000) {
          __len = __len - 1;
          goto LAB_00113e43;
        }
        if (uVar8 < 10000) goto LAB_00113e43;
        uVar9 = uVar9 / 10000;
        uVar5 = __len + 4;
      } while (99999 < uVar8);
      __len = __len + 1;
    }
LAB_00113e43:
    local_50 = local_40;
    ::std::__cxx11::string::_M_construct((ulong)&local_50,(char)__len - (char)((int)uVar3 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar3 >> 0x1f) + (long)local_50),__len,__val);
    uVar9 = 0xf;
    if (local_70 != local_60) {
      uVar9 = local_60[0];
    }
    if (uVar9 < (ulong)(local_48 + local_68)) {
      uVar9 = 0xf;
      if (local_50 != local_40) {
        uVar9 = local_40[0];
      }
      if (uVar9 < (ulong)(local_48 + local_68)) goto LAB_00113eba;
      puVar6 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_70);
    }
    else {
LAB_00113eba:
      puVar6 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_50);
    }
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    psVar1 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar1) {
      local_90.field_2._M_allocated_capacity = *psVar1;
      local_90.field_2._8_8_ = puVar6[3];
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar1;
      local_90._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_90._M_string_length = puVar6[1];
    *puVar6 = psVar1;
    puVar6[1] = 0;
    *(undefined1 *)psVar1 = 0;
    plVar7 = (long *)::std::__cxx11::string::append((char *)&local_90);
    puVar10 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar10) {
      local_a0 = *puVar10;
      lStack_98 = plVar7[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *puVar10;
      local_b0 = (ulong *)*plVar7;
    }
    local_a8 = plVar7[1];
    *plVar7 = (long)puVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b0);
    if (local_b0 != &local_a0) {
      operator_delete(local_b0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    puVar10 = local_70;
    if (local_70 == local_60) goto LAB_00113fc5;
  }
  operator_delete(puVar10);
LAB_00113fc5:
  bVar2 = (this->super_OptionBase<CLI::Option>).required_;
  if (bVar2 == true) {
    local_b0 = &local_a0;
    pcVar4 = (__return_storage_ptr__->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar4,pcVar4 + __return_storage_ptr__->_M_string_length);
  }
  else {
    ::std::operator+(&local_90,"[",__return_storage_ptr__);
    puVar6 = (undefined8 *)::std::__cxx11::string::append((char *)&local_90);
    local_b0 = &local_a0;
    puVar10 = puVar6 + 2;
    if ((ulong *)*puVar6 == puVar10) {
      local_a0 = *puVar10;
      lStack_98 = puVar6[3];
    }
    else {
      local_a0 = *puVar10;
      local_b0 = (ulong *)*puVar6;
    }
    local_a8 = puVar6[1];
    *puVar6 = puVar10;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
  }
  ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b0);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if ((bVar2 == false) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2)) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string help_positional() const {
        std::string out = pname_;
        if(get_expected() > 1)
            out = out + "(" + std::to_string(get_expected()) + "x)";
        else if(get_expected() == -1)
            out = out + "...";
        out = get_required() ? out : "[" + out + "]";
        return out;
    }